

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsIsRuntimeExecutionDisabled(JsRuntimeHandle runtimeHandle,bool *isDisabled)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtRuntime *pJVar3;
  
  if (runtimeHandle != (JsRuntimeHandle)0x0) {
    if (isDisabled == (bool *)0x0) {
      JVar2 = JsErrorNullArgument;
    }
    else {
      *isDisabled = false;
      pJVar3 = JsrtRuntime::FromHandle(runtimeHandle);
      bVar1 = ThreadContext::IsExecutionDisabled(pJVar3->threadContext);
      *isDisabled = bVar1;
      JVar2 = JsNoError;
    }
    return JVar2;
  }
  return JsErrorInvalidArgument;
}

Assistant:

CHAKRA_API JsIsRuntimeExecutionDisabled(_In_ JsRuntimeHandle runtimeHandle, _Out_ bool *isDisabled)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(isDisabled);
    *isDisabled = false;

    ThreadContext* threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    *isDisabled = threadContext->IsExecutionDisabled();
    return JsNoError;
}